

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O2

int gauden_set_const_dim_mgau(gauden_t *g,uint32 n_m,uint32 n_d)

{
  vector_t ***ppppfVar1;
  
  g->n_mgau = n_m;
  g->n_density = n_d;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
          ,0x111,"%d mgau, %d densities/mgau\n",(ulong)n_m,(ulong)n_d);
  if (g->n_feat == 0) {
    __assert_fail("g->n_feat > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                  ,0x113,"int gauden_set_const_dim_mgau(gauden_t *, uint32, uint32)");
  }
  if (g->n_mgau != 0) {
    if (g->n_density != 0) {
      ppppfVar1 = gauden_alloc_param(n_m,g->n_feat,n_d,g->veclen);
      g->mean = ppppfVar1;
      ppppfVar1 = gauden_alloc_param(n_m,g->n_feat,n_d,g->veclen);
      g->var = ppppfVar1;
      return 0;
    }
    __assert_fail("g->n_density > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                  ,0x115,"int gauden_set_const_dim_mgau(gauden_t *, uint32, uint32)");
  }
  __assert_fail("g->n_mgau > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                ,0x114,"int gauden_set_const_dim_mgau(gauden_t *, uint32, uint32)");
}

Assistant:

int
gauden_set_const_dim_mgau(gauden_t *g,
			  uint32 n_m,
			  uint32 n_d)
{
    g->n_mgau = n_m;
    g->n_density = n_d;

    E_INFO("%d mgau, %d densities/mgau\n",
	   n_m, n_d);

    assert(g->n_feat > 0);
    assert(g->n_mgau > 0);
    assert(g->n_density > 0);

    g->mean = gauden_alloc_param(n_m, g->n_feat, n_d, g->veclen);
    g->var  = gauden_alloc_param(n_m, g->n_feat, n_d, g->veclen);
    
    return S3_SUCCESS;
}